

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O0

string * __thiscall JointActionDiscrete::SoftPrintBrief_abi_cxx11_(JointActionDiscrete *this)

{
  bool bVar1;
  reference ppAVar2;
  string *in_RDI;
  const_iterator last;
  const_iterator it;
  stringstream ss;
  ostream *in_stack_fffffffffffffdf8;
  string *this_00;
  string local_1c8 [32];
  ActionDiscrete **local_1a8;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0._M_current =
       (ActionDiscrete **)
       std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::begin
                 ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)
                  in_stack_fffffffffffffdf8);
  local_1a8 = (ActionDiscrete **)
              std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::end
                        ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)
                         in_stack_fffffffffffffdf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                             *)in_stack_fffffffffffffdf8), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
              ::operator*(&local_1a0);
    if (*ppAVar2 != (ActionDiscrete *)0x0) {
      in_stack_fffffffffffffdf8 = local_188;
      ppAVar2 = __gnu_cxx::
                __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                ::operator*(&local_1a0);
      (*((*ppAVar2)->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity[3])
                (local_1c8);
      std::operator<<(in_stack_fffffffffffffdf8,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
    __gnu_cxx::
    __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
    ::operator-((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                 *)this_00,(difference_type)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (bVar1) {
      std::operator<<(local_188,"_");
    }
    __gnu_cxx::
    __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
    ::operator++((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return this_00;
}

Assistant:

string JointActionDiscrete::SoftPrintBrief() const
{
    stringstream ss;
    vector<const ActionDiscrete*>::const_iterator it =  _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last =  _m_apVector.end();
    
    while(it != last)
    {
        if(*it != 0)
            ss << (*it)->SoftPrintBrief();
        if(it != last-1)
            ss << "_";
        it++;
    }
    return(ss.str());
}